

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimemap.c
# Opt level: O0

void h2o_mimemap_on_context_init(h2o_mimemap_t *mimemap,h2o_context_t *ctx)

{
  anon_enum_32 aVar1;
  h2o_mimemap_type_t *phVar2;
  uint local_2c;
  khint_t __i;
  h2o_mimemap_type_t *type;
  char *ext;
  h2o_context_t *ctx_local;
  h2o_mimemap_t *mimemap_local;
  
  for (local_2c = 0; local_2c != mimemap->extmap->n_buckets; local_2c = local_2c + 1) {
    if ((mimemap->extmap->flags[local_2c >> 4] >> (sbyte)((local_2c & 0xf) << 1) & 3) == 0) {
      phVar2 = mimemap->extmap->vals[local_2c];
      aVar1 = phVar2->type;
      if ((aVar1 != H2O_MIMEMAP_TYPE_MIMETYPE) && (aVar1 == H2O_MIMEMAP_TYPE_DYNAMIC)) {
        h2o_context_init_pathconf_context(ctx,(h2o_pathconf_t *)&(phVar2->data).field_0);
      }
    }
  }
  return;
}

Assistant:

void h2o_mimemap_on_context_init(h2o_mimemap_t *mimemap, h2o_context_t *ctx)
{
    const char *ext;
    h2o_mimemap_type_t *type;

    kh_foreach(mimemap->extmap, ext, type, {
        switch (type->type) {
        case H2O_MIMEMAP_TYPE_DYNAMIC:
            h2o_context_init_pathconf_context(ctx, &type->data.dynamic.pathconf);
            break;
        case H2O_MIMEMAP_TYPE_MIMETYPE:
            break;
        }
    });
}